

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_resize_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_122557b::AV1ResizeXTest_DISABLED_SpeedTest_Test::
~AV1ResizeXTest_DISABLED_SpeedTest_Test(AV1ResizeXTest_DISABLED_SpeedTest_Test *this)

{
  void *in_RDI;
  
  ~AV1ResizeXTest_DISABLED_SpeedTest_Test((AV1ResizeXTest_DISABLED_SpeedTest_Test *)0xb50168);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_P(AV1ResizeXTest, DISABLED_SpeedTest) { SpeedTest(); }